

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::writeBuild(D3MFExporter *this)

{
  ostringstream *poVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  
  poVar1 = &this->mModelOutput;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,XmlTag::build_abi_cxx11_,DAT_008ddad8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cVar2 = (char)poVar1;
  if ((this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,XmlTag::item_abi_cxx11_,DAT_008ddaf8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," objectid=\"",0xb);
      uVar4 = uVar4 + 1;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)&this->mModelOutput + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    } while (uVar4 < (ulong)((long)(this->mBuildItems).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->mBuildItems).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,XmlTag::build_abi_cxx11_,DAT_008ddad8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void D3MFExporter::writeBuild() {
    mModelOutput << "<" << XmlTag::build << ">" << std::endl;

    for ( size_t i = 0; i < mBuildItems.size(); ++i ) {
        mModelOutput << "<" << XmlTag::item << " objectid=\"" << i + 1 << "\"/>";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::build << ">";
    mModelOutput << std::endl;
}